

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall
ON_Extrusion::GetBrepFormComponentIndex
          (ON_Extrusion *this,ON_COMPONENT_INDEX extrusion_ci,double extrusion_profile_parameter,
          ON_Brep *brep,bool bSmoothFaces,ON_COMPONENT_INDEX *brep_ci,ON_Interval *profile_subdomain
          )

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ON_Curve *pOVar6;
  uint uVar7;
  bool bCountProfileDiscontinuities;
  int face_index;
  ON_Interval face_profile_domain;
  int local_68;
  byte local_61;
  ON_COMPONENT_INDEX *local_60;
  ON_Interval *local_58;
  double local_50;
  ON_Interval local_48;
  ON_COMPONENT_INDEX local_38;
  
  local_58 = profile_subdomain;
  local_50 = extrusion_profile_parameter;
  local_38 = extrusion_ci;
  ON_COMPONENT_INDEX::UnSet(brep_ci);
  local_68 = -1;
  ON_Interval::ON_Interval(&local_48,-1.23432101234321e+308,-1.23432101234321e+308);
  uVar2 = IsCapped(this);
  iVar3 = ProfileCount(this);
  if (iVar3 < 1) {
    return false;
  }
  local_60 = brep_ci;
  pOVar6 = Profile(this,0);
  if (pOVar6 == (ON_Curve *)0x0) {
    return false;
  }
  iVar4 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar6);
  local_61 = (byte)iVar4;
  if ((iVar3 != 1 & (local_61 ^ 1)) != 0) {
    return false;
  }
  iVar4 = 0;
  if (local_61 != 0) {
    iVar4 = (uVar2 == 3) + 1;
  }
  if (uVar2 == 0) {
    iVar4 = 0;
  }
  if (brep == (ON_Brep *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    if ((int)uVar7 < iVar4 + iVar3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_beam.cpp"
                 ,0xcf4,"","brep_form parameter cannot be extrusion\'s BrepForm()");
      return false;
    }
  }
  bVar1 = (uint)(iVar4 + iVar3) < uVar7;
  bCountProfileDiscontinuities = bVar1 || bSmoothFaces;
  iVar5 = iVar3;
  if (bVar1 || bSmoothFaces) {
    iVar5 = GetSmoothSideCount(this);
  }
  uVar7 = local_38.m_index;
  switch(local_38.m_type) {
  case extrusion_bottom_profile:
  case extrusion_top_profile:
    if (iVar3 <= (int)uVar7 || (long)local_38 < 0) {
      return false;
    }
    bVar1 = GetBrepFormFaceIndex
                      (this,uVar7,local_50,bCountProfileDiscontinuities,&local_68,&local_48);
    if (!bVar1) {
      return false;
    }
    iVar3 = 0;
    if (0 < local_68) {
      iVar3 = local_68 * 3 + 1;
    }
    if (local_38.m_type == extrusion_top_profile) {
      iVar3 = (iVar3 - (uint)(local_61 & local_68 == iVar5 + -1)) + 2;
    }
    local_60->m_index = iVar3;
    local_60->m_type = brep_edge;
    goto LAB_003f54c6;
  case extrusion_wall_edge:
    if (iVar3 * 2 <= (int)uVar7 || (long)local_38 < 0) {
      return false;
    }
    bVar1 = GetBrepFormFaceIndex
                      (this,uVar7 >> 1,local_50,bCountProfileDiscontinuities,&local_68,&local_48);
    if (!bVar1) {
      return false;
    }
    local_60->m_index = local_68 * 4 + 1;
    local_60->m_type = brep_edge;
    break;
  case extrusion_wall_surface:
    if (iVar5 <= (int)uVar7 || (long)local_38 < 0) {
      return false;
    }
    bVar1 = GetBrepFormFaceIndex
                      (this,uVar7,local_50,bCountProfileDiscontinuities,&local_68,&local_48);
    if (!bVar1) {
      return false;
    }
    local_60->m_index = local_68;
    local_60->m_type = brep_face;
LAB_003f54c6:
    if (local_58 != (ON_Interval *)0x0) {
      local_58->m_t[0] = local_48.m_t[0];
      local_58->m_t[1] = local_48.m_t[1];
    }
    break;
  case extrusion_cap_surface:
    if (2 < (int)uVar7 || (long)local_38 < 0) {
      return false;
    }
    if (uVar7 == 1 && (uVar2 & 1) == 0) {
      return false;
    }
    if (uVar7 == 2 && (uVar2 | 0xfffffffc) < 0xfffffffe) {
      return false;
    }
    if (brep == (ON_Brep *)0x0) {
      bVar1 = GetBrepFormFaceIndex
                        (this,iVar3,local_50,bCountProfileDiscontinuities,&local_68,&local_48);
      if (!bVar1) {
        return false;
      }
    }
    else {
      local_68 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_count - iVar4;
    }
    local_60->m_index = local_68 + uVar7 + -1;
    local_60->m_type = brep_face;
  }
  bVar1 = ON_COMPONENT_INDEX::IsBrepComponentIndex(local_60);
  if (!bVar1) {
    ON_COMPONENT_INDEX::UnSet(local_60);
    return false;
  }
  return true;
}

Assistant:

bool ON_Extrusion::GetBrepFormComponentIndex(
  ON_COMPONENT_INDEX extrusion_ci,
  double extrusion_profile_parameter,
  const ON_Brep* brep,
  bool bSmoothFaces,
  ON_COMPONENT_INDEX& brep_ci,
  ON_Interval* profile_subdomain
) const
{
  brep_ci.UnSet();
  int face_index = -1;
  ON_Interval face_profile_domain(ON_UNSET_VALUE,ON_UNSET_VALUE);

  const int is_capped = IsCapped();
  if ( is_capped < 0 || is_capped > 3 )
    return false;
  const int profile_count = ProfileCount();
  if ( profile_count < 1 )
    return false;
  const ON_Curve* profile0 = Profile(0);
  if ( 0 == profile0 )
    return false;
  const bool bClosedProfile = profile0->IsClosed() ? true : false;
  if ( profile_count > 1 && !bClosedProfile )
    return false;
  const int edges_per_wall_face = 4;
  const int cap_count = (0 == is_capped || !bClosedProfile) ? 0 : ((3==is_capped)?2:1);
  int brep_face_count = ( nullptr != brep ) ? brep->m_F.Count() : 0;
  if ( nullptr != brep && brep_face_count < profile_count + cap_count )
  {
    ON_ERROR("brep_form parameter cannot be extrusion's BrepForm()");
    return false;
  }
  bool bCountProfileDiscontinuities = bSmoothFaces || ( brep_face_count > profile_count + cap_count );
  int side_count = (bCountProfileDiscontinuities) ? GetSmoothSideCount(*this) : profile_count;

  switch(extrusion_ci.m_type)
  {
  case ON_COMPONENT_INDEX::extrusion_bottom_profile:
  case ON_COMPONENT_INDEX::extrusion_top_profile:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;

    // first face has edges_per_wall_face edges, the subsequent ones have one less
    if (face_index > 0)
      brep_ci.m_index = edges_per_wall_face + ((edges_per_wall_face-1) * (face_index-1));
    else
      brep_ci.m_index = 0;

    if (ON_COMPONENT_INDEX::extrusion_top_profile == extrusion_ci.m_type)
    {
      if ( bClosedProfile && face_index == side_count - 1)
        brep_ci.m_index += 1; // in closed case the last face has an already existing edge between bottom and top edge
      else
        brep_ci.m_index += 2;
    }
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_edge:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= 2*profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index/2, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = edges_per_wall_face*face_index+1;
    if ( !bClosedProfile && 1 == (face_index % 1) )
      brep_ci.m_index += 2;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= side_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = face_index;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_cap_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index > 2 )
      return false;
    if ( 1 == extrusion_ci.m_index && (is_capped != 1 && is_capped != 3) )
      return false;
    if ( 2 == extrusion_ci.m_index && (is_capped != 2 && is_capped != 3) )
      return false;
    if ( 0 != brep )
    {
      face_index = brep->m_F.Count()-cap_count;
    }
    else if ( !GetBrepFormFaceIndex( *this, profile_count, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
    {
      return false;
    }

    brep_ci.m_index = face_index+extrusion_ci.m_index-1;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    break;

  case ON_COMPONENT_INDEX::extrusion_path:
    // There is no corresponding brep component index
    break;

  default:
    // Other ON_COMPONENT_INDEX::TYPE values intentionally ignored
    break;
  }

  if ( !brep_ci.IsBrepComponentIndex() )
  {
    brep_ci.UnSet();
    return false;
  }

  return true;
}